

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::FeatureDescription::MergePartialFromCodedStream
          (FeatureDescription *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  FeatureType *this_02;
  pair<int,_int> pVar8;
  char *field_name;
  char cVar9;
  ulong uVar10;
  string *psVar11;
  pointer data;
  
  this_00 = &this->shortdescription_;
  this_01 = &this->name_;
LAB_00449921:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00449944;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00449944:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    uVar5 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_00449965;
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar6 == 3) {
      if (cVar9 != '\x1a') goto LAB_00449965;
      this_02 = this->type_;
      if (this_02 == (FeatureType *)0x0) {
        this_02 = (FeatureType *)operator_new(0x28);
        FeatureType::FeatureType(this_02);
        this->type_ = this_02;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar4 = FeatureType::MergePartialFromCodedStream(this_02,input);
      if (!bVar4) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
joined_r0x00449ae4:
      if (!bVar4) {
        return false;
      }
      goto LAB_00449921;
    }
    if (uVar6 == 2) {
      if (cVar9 == '\x12') {
        psVar11 = this_00->ptr_;
        if (psVar11 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_00->ptr_;
        }
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar11);
        if (!bVar4) {
          return false;
        }
        data = (this_00->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_00->ptr_->_M_string_length;
        field_name = "CoreML.Specification.FeatureDescription.shortDescription";
        goto LAB_00449a30;
      }
LAB_00449965:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
      goto joined_r0x00449ae4;
    }
    if ((uVar6 != 1) || (cVar9 != '\n')) goto LAB_00449965;
    psVar11 = this_01->ptr_;
    if (psVar11 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (this_01,(string *)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      psVar11 = this_01->ptr_;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar11);
    if (!bVar4) {
      return false;
    }
    data = (this_01->ptr_->_M_dataplus)._M_p;
    iVar7 = (int)this_01->ptr_->_M_string_length;
    field_name = "CoreML.Specification.FeatureDescription.name";
LAB_00449a30:
    bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      (data,iVar7,PARSE,field_name);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool FeatureDescription::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.FeatureDescription)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.FeatureDescription.name"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string shortDescription = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_shortdescription()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->shortdescription().data(), this->shortdescription().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.FeatureDescription.shortDescription"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.FeatureType type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.FeatureDescription)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.FeatureDescription)
  return false;
#undef DO_
}